

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::Resign(CommissionerImpl *this,ErrorHandler *aHandler)

{
  bool bVar1;
  uint uVar2;
  Error local_40;
  ErrorHandler *local_18;
  ErrorHandler *aHandler_local;
  CommissionerImpl *this_local;
  
  local_18 = aHandler;
  aHandler_local = (ErrorHandler *)this;
  uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((uVar2 & 1) != 0) {
    SendKeepAlive(this,&this->mKeepAliveTimer,false);
  }
  bVar1 = Timer::IsRunning(&this->mKeepAliveTimer);
  if (bVar1) {
    Timer::Stop(&this->mKeepAliveTimer);
  }
  (*(this->super_Commissioner)._vptr_Commissioner[6])();
  Error::Error(&local_40);
  std::function<void_(ot::commissioner::Error)>::operator()(aHandler,&local_40);
  Error::~Error(&local_40);
  return;
}

Assistant:

void CommissionerImpl::Resign(ErrorHandler aHandler)
{
    if (IsActive())
    {
        SendKeepAlive(mKeepAliveTimer, false);
    }

    if (mKeepAliveTimer.IsRunning())
    {
        mKeepAliveTimer.Stop();
    }

    Disconnect();

    aHandler(ERROR_NONE);
}